

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.h
# Opt level: O2

void gm_dealloc_data(GlobalMotionData *gm_data)

{
  aom_free(gm_data->segment_map);
  gm_data->segment_map = (uint8_t *)0x0;
  aom_free(gm_data->motion_models[0].inliers);
  gm_data->motion_models[0].inliers = (int *)0x0;
  return;
}

Assistant:

static inline void gm_dealloc_data(GlobalMotionData *gm_data) {
  aom_free(gm_data->segment_map);
  gm_data->segment_map = NULL;
  for (int m = 0; m < RANSAC_NUM_MOTIONS; m++) {
    aom_free(gm_data->motion_models[m].inliers);
    gm_data->motion_models[m].inliers = NULL;
  }
}